

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_mail_resp(connectdata *conn,int smtpcode,smtpstate instate)

{
  SessionHandle *data;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  connectdata *conn_local;
  
  if (smtpcode / 100 == 2) {
    data._4_4_ = smtp_perform_rcpt_to(conn);
  }
  else {
    Curl_failf(conn->data,"MAIL failed: %d",(ulong)(uint)smtpcode);
    data._4_4_ = CURLE_SEND_ERROR;
  }
  return data._4_4_;
}

Assistant:

static CURLcode smtp_state_mail_resp(struct connectdata *conn, int smtpcode,
                                     smtpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;

  (void)instate; /* no use for this yet */

  if(smtpcode/100 != 2) {
    failf(data, "MAIL failed: %d", smtpcode);
    result = CURLE_SEND_ERROR;
  }
  else
    /* Start the RCPT TO command */
    result = smtp_perform_rcpt_to(conn);

  return result;
}